

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O3

int read_proc(void)

{
  if (result <= g_maxCount) {
    do {
      if ((q.tail_)->next_ == (node *)0x0) {
        usleep(1);
      }
      else {
        q.tail_ = (q.tail_)->next_;
        result = (q.tail_)->value_;
      }
    } while (result <= g_maxCount);
  }
  return 0;
}

Assistant:

int read_proc()
{
    int number = 0 ; 
    // You can also peek at the front item of the queue (consumer only)
    while(result <= g_maxCount)
    {
	//int* front = q.peek();
	bool ret = q.try_dequeue(number); 
	if (ret)
	{
	    Log("result is "<< result << " num is " << number ); 
	    result = number; 
	}
	else 
	{
	    usleep(1); 
	}
    }
    Log(" read finished " ); ; 


    return 0; 
}